

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

StringView __thiscall Corrade::Containers::String::findLast(String *this,StringView substring)

{
  StringView substring_00;
  BasicStringView<const_char> BVar1;
  StringView SVar2;
  BasicStringView<const_char> local_40;
  String *local_30;
  String *this_local;
  StringView substring_local;
  
  substring_local._data = (char *)substring._sizePlusFlags;
  this_local = (String *)substring._data;
  local_30 = this;
  BasicStringView<const_char>::BasicStringView<const_char,_0>(&local_40,this);
  substring_00._sizePlusFlags = (size_t)substring_local._data;
  substring_00._data = (char *)this_local;
  BVar1 = BasicStringView<const_char>::findLastOr(&local_40,substring_00,(char *)0x0);
  SVar2._data = BVar1._data;
  SVar2._sizePlusFlags = BVar1._sizePlusFlags;
  return SVar2;
}

Assistant:

StringView String::findLast(const StringView substring) const {
    /* Calling straight into the concrete implementation to reduce call stack
       depth */
    return StringView{*this}.findLastOr(substring, nullptr);
}